

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_lea(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 ret;
  uint uVar1;
  TCGv_i32 arg;
  TCGv_i32 *ppTVar2;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = insn >> 9 & 7;
  ppTVar2 = s->writeback;
  if (((uint)s->writeback_mask >> uVar1 & 1) == 0) {
    ppTVar2 = tcg_ctx->cpu_aregs;
  }
  ret = ppTVar2[uVar1];
  arg = gen_lea(env,s,insn,2);
  if (arg != tcg_ctx->NULL_QREG) {
    tcg_gen_mov_i32(tcg_ctx,ret,arg);
    return;
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(lea)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv tmp;

    reg = AREG(insn, 9);
    tmp = gen_lea(env, s, insn, OS_LONG);
    if (IS_NULL_QREG(tmp)) {
        gen_addr_fault(s);
        return;
    }
    tcg_gen_mov_i32(tcg_ctx, reg, tmp);
}